

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Exa3_ManAddCnfStart(Exa3_Man_t_conflict *p,int fOnlyAnd)

{
  sat_solver *s;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *begin;
  int *end;
  Vec_Int_t *vArray;
  int nLits;
  int iVarStart;
  int m;
  int n;
  int k;
  int j;
  int i;
  int pLits2 [2];
  int pLits [32];
  int fOnlyAnd_local;
  Exa3_Man_t_conflict *p_local;
  
  k = p->nVars;
  do {
    if (p->nObjs <= k) {
      k = 0;
      while( true ) {
        if (p->nObjs + -1 <= k) {
          return 1;
        }
        p_00 = Vec_WecEntry(p->vOutLits,k);
        iVar1 = Vec_IntSize(p_00);
        if (iVar1 < 1) break;
        s = p->pSat;
        begin = Vec_IntArray(p_00);
        end = Vec_IntLimit(p_00);
        iVar1 = sat_solver_addclause(s,begin,end);
        if (iVar1 == 0) {
          return 0;
        }
        k = k + 1;
      }
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x4e1,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
    }
    iVar1 = p->LutMask * (k - p->nVars);
    for (m = 0; m < p->nLutSize; m = m + 1) {
      vArray._4_4_ = 0;
      for (n = 0; n < p->nObjs; n = n + 1) {
        if (p->VarMarks[k][m][n] != 0) {
          iVar2 = Abc_Var2Lit(p->VarMarks[k][m][n],0);
          pLits2[vArray._4_4_] = iVar2;
          vArray._4_4_ = vArray._4_4_ + 1;
        }
      }
      if (vArray._4_4_ < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x4a3,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
      }
      iVar2 = sat_solver_addclause(p->pSat,pLits2,pLits2 + vArray._4_4_);
      if (iVar2 == 0) {
        return 0;
      }
      for (iVarStart = 0; nLits = iVarStart, iVarStart < vArray._4_4_; iVarStart = iVarStart + 1) {
        while (nLits = nLits + 1, nLits < vArray._4_4_) {
          j = Abc_LitNot(pLits2[iVarStart]);
          i = Abc_LitNot(pLits2[nLits]);
          iVar2 = sat_solver_addclause(p->pSat,&j,pLits2);
          if (iVar2 == 0) {
            return 0;
          }
        }
      }
      if (m == p->nLutSize + -1) break;
      for (n = 0; n < p->nObjs; n = n + 1) {
        if (p->VarMarks[k][m][n] != 0) {
          for (iVarStart = n; iVarStart < p->nObjs; iVarStart = iVarStart + 1) {
            if (p->VarMarks[k][m + 1][iVarStart] != 0) {
              j = Abc_Var2Lit(p->VarMarks[k][m][n],1);
              i = Abc_Var2Lit(p->VarMarks[k][m + 1][iVarStart],1);
              iVar2 = sat_solver_addclause(p->pSat,&j,pLits2);
              if (iVar2 == 0) {
                return 0;
              }
            }
          }
        }
      }
    }
    if (p->nLutSize == 2) {
      for (m = 0; m < 3; m = m + 1) {
        pLits2[0] = Abc_Var2Lit(iVar1 + 1,(uint)(m == 1));
        pLits2[1] = Abc_Var2Lit(iVar1 + 2,(uint)(m == 2));
        pLits[0] = Abc_Var2Lit(iVar1 + 3,(uint)(m != 0));
        iVar2 = sat_solver_addclause(p->pSat,pLits2,pLits + 1);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if (fOnlyAnd != 0) {
        pLits2[0] = Abc_Var2Lit(iVar1 + 1,1);
        pLits2[1] = Abc_Var2Lit(iVar1 + 2,1);
        pLits[0] = Abc_Var2Lit(iVar1 + 3,0);
        iVar1 = sat_solver_addclause(p->pSat,pLits2,pLits + 1);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static int Exa3_ManAddCnfStart( Exa3_Man_t * p, int fOnlyAnd )
{
    int pLits[MAJ_NOBJS], pLits2[2], i, j, k, n, m;
    // input constraints
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        int iVarStart = 1 + p->LutMask*(i - p->nVars);
        for ( k = 0; k < p->nLutSize; k++ )
        {
            int nLits = 0;
            for ( j = 0; j < p->nObjs; j++ )
                if ( p->VarMarks[i][k][j] )
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 0 );
            assert( nLits > 0 );
            // input uniqueness
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                return 0;
            for ( n = 0;   n < nLits; n++ )
            for ( m = n+1; m < nLits; m++ )
            {
                pLits2[0] = Abc_LitNot(pLits[n]);
                pLits2[1] = Abc_LitNot(pLits[m]);
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
            if ( k == p->nLutSize - 1 )
                break;
            // symmetry breaking
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            for ( n = j; n < p->nObjs; n++ ) if ( p->VarMarks[i][k+1][n] )
            {
                pLits2[0] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                pLits2[1] = Abc_Var2Lit( p->VarMarks[i][k+1][n], 1 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
        }
//#ifdef USE_NODE_ORDER
        // node ordering
        if ( p->pPars->fUseIncr )
        {
            for ( j = p->nVars; j < i; j++ )
            for ( n = 0;   n < p->nObjs; n++ ) if ( p->VarMarks[i][0][n] )
            for ( m = n+1; m < p->nObjs; m++ ) if ( p->VarMarks[j][0][m] )
            {
                pLits2[0] = Abc_Var2Lit( p->VarMarks[i][0][n], 1 );
                pLits2[1] = Abc_Var2Lit( p->VarMarks[j][0][m], 1 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
        }
//#endif
        if ( p->nLutSize != 2 )
            continue;
        // two-input functions
        for ( k = 0; k < 3; k++ )
        {
            pLits[0] = Abc_Var2Lit( iVarStart,   k==1 );
            pLits[1] = Abc_Var2Lit( iVarStart+1, k==2 );
            pLits[2] = Abc_Var2Lit( iVarStart+2, k!=0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
        if ( fOnlyAnd )
        {
            pLits[0] = Abc_Var2Lit( iVarStart,   1 );
            pLits[1] = Abc_Var2Lit( iVarStart+1, 1 );
            pLits[2] = Abc_Var2Lit( iVarStart+2, 0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
    }
    // outputs should be used
    for ( i = 0; i < p->nObjs - 1; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry(p->vOutLits, i);
        assert( Vec_IntSize(vArray) > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vArray), Vec_IntSize(vArray) ) )
            return 0;
    }
    return 1;
}